

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O2

void __thiscall
Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
          (TiledRgbaOutputFile *this,char *name,int tileXSize,int tileYSize,LevelMode mode,
          LevelRoundingMode rmode,Box2i *displayWindow,Box2i *dataWindow,RgbaChannels rgbaChannels,
          float pixelAspectRatio,V2f screenWindowCenter,float screenWindowWidth,LineOrder lineOrder,
          Compression compression,int numThreads)

{
  TiledOutputFile *this_00;
  ToYa *this_01;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  undefined4 in_stack_00000024;
  int in_stack_00000038;
  Header hd;
  TileDescription local_40;
  
  this->_vptr_TiledRgbaOutputFile = (_func_int **)&PTR__TiledRgbaOutputFile_003d4558;
  auVar1._0_12_ = ZEXT812(0);
  auVar1._12_4_ = 0;
  this->_outputFile = (TiledOutputFile *)auVar1._0_8_;
  this->_toYa = (ToYa *)auVar1._8_8_;
  iVar3 = -(uint)((dataWindow->max).x < (dataWindow->min).x);
  iVar4 = -(uint)((dataWindow->max).y < (dataWindow->min).y);
  auVar2._4_4_ = iVar3;
  auVar2._0_4_ = iVar3;
  auVar2._8_4_ = iVar4;
  auVar2._12_4_ = iVar4;
  iVar3 = movmskpd(0x3d4558,auVar2);
  if (iVar3 != 0) {
    dataWindow = displayWindow;
  }
  Header::Header(&hd,displayWindow,dataWindow,pixelAspectRatio,
                 (V2f *)CONCAT44(in_stack_00000024,lineOrder),screenWindowCenter.x,compression,
                 numThreads);
  anon_unknown_22::insertChannels(&hd,rgbaChannels,name);
  local_40.xSize = tileXSize;
  local_40.ySize = tileYSize;
  local_40.mode = mode;
  local_40.roundingMode = rmode;
  Header::setTileDescription(&hd,&local_40);
  this_00 = (TiledOutputFile *)operator_new(0x20);
  TiledOutputFile::TiledOutputFile(this_00,name,&hd,in_stack_00000038);
  this->_outputFile = this_00;
  if ((rgbaChannels & WRITE_Y) != 0) {
    this_01 = (ToYa *)operator_new(0x50);
    ToYa::ToYa(this_01,this_00,rgbaChannels);
    this->_toYa = this_01;
  }
  Header::~Header(&hd);
  return;
}

Assistant:

TiledRgbaOutputFile::TiledRgbaOutputFile (
    const char                    name[],
    int                           tileXSize,
    int                           tileYSize,
    LevelMode                     mode,
    LevelRoundingMode             rmode,
    const IMATH_NAMESPACE::Box2i& displayWindow,
    const IMATH_NAMESPACE::Box2i& dataWindow,
    RgbaChannels                  rgbaChannels,
    float                         pixelAspectRatio,
    const IMATH_NAMESPACE::V2f    screenWindowCenter,
    float                         screenWindowWidth,
    LineOrder                     lineOrder,
    Compression                   compression,
    int                           numThreads)
    : _outputFile (0), _toYa (0)
{
    Header hd (
        displayWindow,
        dataWindow.isEmpty () ? displayWindow : dataWindow,
        pixelAspectRatio,
        screenWindowCenter,
        screenWindowWidth,
        lineOrder,
        compression);

    insertChannels (hd, rgbaChannels, name);
    hd.setTileDescription (TileDescription (tileXSize, tileYSize, mode, rmode));
    _outputFile = new TiledOutputFile (name, hd, numThreads);

    if (rgbaChannels & WRITE_Y) _toYa = new ToYa (*_outputFile, rgbaChannels);
}